

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolInfo.cpp
# Opt level: O0

CError * __thiscall
CError::GetHasNoMemberErrorMessage(CError *this,string *className,string *fieldName)

{
  string local_88 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48 [39];
  undefined1 local_21;
  string *local_20;
  string *fieldName_local;
  string *className_local;
  string *errorMessage;
  
  local_21 = 0;
  local_20 = fieldName;
  fieldName_local = className;
  className_local = &this->message;
  std::operator+((char *)local_88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"Class: ");
  std::operator+(local_68,(char *)local_88);
  std::operator+(local_48,local_68);
  std::operator+(&this->message,(char *)local_48);
  std::__cxx11::string::~string((string *)local_48);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string(local_88);
  return this;
}

Assistant:

std::string CError::GetHasNoMemberErrorMessage(const std::string &className, const std::string &fieldName) {
    std::string errorMessage = "Class: " + className + " has no member: " + fieldName + ".";
	return errorMessage;
}